

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O2

void show_map_spot(int x,int y)

{
  rm (*parVar1) [21];
  level *plVar2;
  uint uVar3;
  
  if ((u.uprops[0x1c].intrinsic != 0) && (uVar3 = mt_random(), uVar3 % 7 != 0)) {
    return;
  }
  plVar2 = level;
  parVar1 = level->locations;
  level->locations[x][y].seenv = 0xff;
  if (plVar2->locations[x][y].typ == '\x10') {
    plVar2->locations[x][y].typ = '\x18';
    unblock_point(x,y);
  }
  if (((undefined1  [12])parVar1[x][y] & (undefined1  [12])0x1fffc0) != (undefined1  [12])0x0) {
    return;
  }
  if (((level->flags).field_0x9 & 0x40) != 0) {
    magic_map_background((xchar)x,(xchar)y,0);
    newsym(x,y);
    return;
  }
  magic_map_background((xchar)x,(xchar)y,1);
  return;
}

Assistant:

static void show_map_spot(int x, int y)
{
    struct rm *loc;

    if (Confusion && rn2(7)) return;
    loc = &level->locations[x][y];

    loc->seenv = SVALL;

    /* Secret corridors are found, but not secret doors. */
    if (loc->typ == SCORR) {
	loc->typ = CORR;
	unblock_point(x,y);
    }

    /* if we don't remember an object or trap there, map it */
    if (!loc->mem_obj && !loc->mem_trap) {
	if (level->flags.hero_memory) {
	    magic_map_background(x,y,0);
	    newsym(x,y);			/* show it, if not blocked */
	} else {
	    magic_map_background(x,y,1);	/* display it */
	}
    }
}